

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

void __thiscall hwnet::TCPListener::Stop(TCPListener *this)

{
  Poller *this_00;
  bool bVar1;
  enable_shared_from_this<hwnet::TCPListener> local_38;
  shared_ptr<hwnet::Channel> local_28;
  bool local_11;
  TCPListener *pTStack_10;
  bool expected;
  TCPListener *this_local;
  
  pTStack_10 = this;
  bVar1 = std::atomic<bool>::load(&this->started,memory_order_seq_cst);
  if (bVar1) {
    local_11 = false;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (&this->stop,&local_11,true,memory_order_seq_cst);
    if (bVar1) {
      this_00 = this->poller_;
      std::enable_shared_from_this<hwnet::TCPListener>::shared_from_this(&local_38);
      std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPListener,void>
                (&local_28,(shared_ptr<hwnet::TCPListener> *)&local_38);
      Poller::Remove(this_00,&local_28);
      std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_28);
      std::shared_ptr<hwnet::TCPListener>::~shared_ptr((shared_ptr<hwnet::TCPListener> *)&local_38);
      close(this->fd);
    }
  }
  return;
}

Assistant:

void TCPListener::Stop() {
	if(!this->started.load()) {
		return;
	}
	bool expected = false;
	if(!this->stop.compare_exchange_strong(expected,true)) {
		return;
	}
	this->poller_->Remove(shared_from_this());
	::close(this->fd);
}